

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char * hts_parse_reg(char *s,int *beg,int *end)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  undefined8 uStack_50;
  int local_48 [2];
  char *local_40;
  char *tmp;
  int local_30;
  int n_hyphen;
  int name_end;
  int l;
  int k;
  int i;
  int *end_local;
  int *beg_local;
  char *s_local;
  
  *end = -1;
  *beg = -1;
  uStack_50 = 0x112131;
  _k = end;
  end_local = beg;
  beg_local = (int *)s;
  sVar2 = strlen(s);
  n_hyphen = (int)sVar2;
  l = n_hyphen;
  do {
    l = l + -1;
    if (l < 0) break;
  } while (*(char *)((long)beg_local + (long)l) != ':');
  local_30 = n_hyphen;
  if (-1 < l) {
    local_30 = l;
  }
  if (local_30 < n_hyphen) {
    tmp._4_4_ = 0;
    l = local_30;
    do {
      while( true ) {
        l = l + 1;
        if (n_hyphen <= l) goto LAB_001121f9;
        if (*(char *)((long)beg_local + (long)l) != '-') break;
        tmp._4_4_ = tmp._4_4_ + 1;
      }
      uStack_50 = 0x1121b7;
      ppuVar3 = __ctype_b_loc();
    } while ((((*ppuVar3)[(int)*(char *)((long)beg_local + (long)l)] & 0x800) != 0) ||
            (*(char *)((long)beg_local + (long)l) == ','));
LAB_001121f9:
    if ((l < n_hyphen) || (1 < tmp._4_4_)) {
      local_30 = n_hyphen;
    }
  }
  if (local_30 < n_hyphen) {
    lVar5 = -((long)(n_hyphen - local_30) + 0x10U & 0xfffffffffffffff0);
    pcVar6 = (char *)((long)local_48 + lVar5);
    name_end = 0;
    l = local_30;
    while (l = l + 1, l < n_hyphen) {
      if (*(char *)((long)beg_local + (long)l) != ',') {
        pcVar6[name_end] = *(char *)((long)beg_local + (long)l);
        name_end = name_end + 1;
      }
    }
    pcVar6[name_end] = '\0';
    local_40 = pcVar6;
    *(undefined8 *)((long)local_48 + lVar5 + -8) = 0x1122af;
    lVar4 = strtol(pcVar6,&local_40,10);
    iVar1 = (int)lVar4 + -1;
    *end_local = iVar1;
    if (iVar1 < 0) {
      *end_local = 0;
    }
    if (*local_40 == '\0') {
      local_48[0] = 0x7fffffff;
    }
    else {
      pcVar6 = local_40 + 1;
      *(undefined8 *)((long)local_48 + lVar5 + -8) = 0x1122ea;
      lVar5 = strtol(pcVar6,&local_40,10);
      local_48[0] = (int)lVar5;
    }
    *_k = local_48[0];
    if (*_k < *end_local) {
      local_30 = n_hyphen;
    }
  }
  if (local_30 == n_hyphen) {
    *end_local = 0;
    *_k = 0x7fffffff;
  }
  return (char *)((long)beg_local + (long)local_30);
}

Assistant:

const char *hts_parse_reg(const char *s, int *beg, int *end)
{
    int i, k, l, name_end;
    *beg = *end = -1;
    name_end = l = strlen(s);
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
    }
    // parse the interval
    if (name_end < l) {
        char *tmp;
        tmp = (char*)alloca(l - name_end + 1);
        for (i = name_end + 1, k = 0; i < l; ++i)
            if (s[i] != ',') tmp[k++] = s[i];
        tmp[k] = 0;
        if ((*beg = strtol(tmp, &tmp, 10) - 1) < 0) *beg = 0;
        *end = *tmp? strtol(tmp + 1, &tmp, 10) : INT_MAX;
        if (*beg > *end) name_end = l;
    }
    if (name_end == l) *beg = 0, *end = INT_MAX;
    return s + name_end;
}